

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O0

CharBuff * new_buff(uint size)

{
  uint size_00;
  CharBuff *pCVar1;
  char *pcVar2;
  CharBuff *buff;
  uint size_local;
  
  pCVar1 = (CharBuff *)malloc(0x18);
  size_00 = size + 1;
  pcVar2 = (char *)malloc((ulong)size_00 + 1);
  pCVar1->body = pcVar2;
  pCVar1->len = 0;
  pCVar1->init_size = size_00;
  pCVar1->buff_size = size_00;
  buff_zero(pCVar1->body,size_00);
  return pCVar1;
}

Assistant:

CharBuff* new_buff(uint size){
    CharBuff* buff = malloc(sizeof(CharBuff));
    size =  MALLOC_SIZE(char, +size);
    buff->body = malloc(MALLOC_SIZE(char, +size));
    buff->len = 0;
    buff->init_size = size;
    buff->buff_size = size;
    buff_zero(buff->body, size);
    return buff;
}